

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,short,11ul>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_short,_11UL> *fmt)

{
  char cVar1;
  char *pcVar2;
  pair<date::static_string<char,_4UL>,_short> *ppVar3;
  size_t k;
  long lVar4;
  ulong uVar5;
  size_t i;
  long lVar6;
  bool bVar7;
  array<bool,_11UL> is_match;
  array<const_char_*,_11UL> str_list;
  char acStack_93 [11];
  long alStack_88 [11];
  
  ppVar3 = fmt->aliases->_M_elems;
  lVar4 = 0;
  do {
    alStack_88[lVar4] = (long)ppVar3;
    acStack_93[lVar4] =
         (((pair<date::static_string<char,_4UL>,_short> *)&ppVar3->first)->first).m_length != 0;
    lVar4 = lVar4 + 1;
    ppVar3 = ppVar3 + 1;
  } while (lVar4 != 0xb);
  lVar4 = 0;
  do {
    if (end->m_position == pos->m_position) {
      return false;
    }
    cVar1 = pos->m_cache[pos->m_position];
    lVar6 = 2;
    bVar7 = false;
    uVar5 = 0;
    do {
      if (acStack_93[uVar5] == '\x01') {
        pcVar2 = (char *)alStack_88[uVar5];
        if (*pcVar2 == cVar1) {
          if (pcVar2[1] == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            *fmt->value = *(value_type_conflict *)
                           (&fmt->aliases->_M_elems[0].first.m_data)[lVar6 * 2]._M_elems;
            break;
          }
          alStack_88[uVar5] = (long)(pcVar2 + 1);
        }
        else {
          acStack_93[uVar5] = '\0';
        }
      }
      bVar7 = 9 < uVar5;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 3;
    } while (uVar5 != 0xb);
    if (!bVar7) {
      return true;
    }
    lVar4 = lVar4 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    if (lVar4 == 4) {
      return false;
    }
  } while( true );
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}